

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O0

void highbd_sad16x4_core_avx2(__m256i *s,__m256i *r,__m256i *sad_acc)

{
  undefined1 auVar1 [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  int i;
  __m256i zero;
  int local_2c4;
  
  for (local_2c4 = 0; local_2c4 < 4; local_2c4 = local_2c4 + 1) {
    auVar1 = vpsubw_avx2(in_RDI[local_2c4],in_RSI[local_2c4]);
    in_RDI[local_2c4] = auVar1;
    auVar1 = vpabsw_avx2(in_RDI[local_2c4]);
    in_RDI[local_2c4] = auVar1;
  }
  auVar1 = vpaddw_avx2(*in_RDI,in_RDI[1]);
  *in_RDI = auVar1;
  auVar1 = vpaddw_avx2(*in_RDI,in_RDI[2]);
  *in_RDI = auVar1;
  auVar1 = vpaddw_avx2(*in_RDI,in_RDI[3]);
  *in_RDI = auVar1;
  auVar1 = vpunpcklwd_avx2(*in_RDI,ZEXT1632(ZEXT816(0)));
  *in_RSI = auVar1;
  auVar1 = vpunpckhwd_avx2(*in_RDI,ZEXT1632(ZEXT816(0)));
  in_RSI[1] = auVar1;
  auVar1 = vpaddd_avx2(*in_RSI,in_RSI[1]);
  *in_RSI = auVar1;
  auVar1 = vpaddd_avx2(*in_RDX,*in_RSI);
  *in_RDX = auVar1;
  return;
}

Assistant:

static inline void highbd_sad16x4_core_avx2(__m256i *s, __m256i *r,
                                            __m256i *sad_acc) {
  const __m256i zero = _mm256_setzero_si256();
  int i;
  for (i = 0; i < 4; i++) {
    s[i] = _mm256_sub_epi16(s[i], r[i]);
    s[i] = _mm256_abs_epi16(s[i]);
  }

  s[0] = _mm256_add_epi16(s[0], s[1]);
  s[0] = _mm256_add_epi16(s[0], s[2]);
  s[0] = _mm256_add_epi16(s[0], s[3]);

  r[0] = _mm256_unpacklo_epi16(s[0], zero);
  r[1] = _mm256_unpackhi_epi16(s[0], zero);

  r[0] = _mm256_add_epi32(r[0], r[1]);
  *sad_acc = _mm256_add_epi32(*sad_acc, r[0]);
}